

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isNearestCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  WrapMode WVar1;
  bool isFixedPoint;
  bool bVar2;
  CmpResultSet resultSet;
  int iVar3;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  TextureFormat *format;
  float fVar9;
  CmpResultSet resSet;
  float depth;
  int y;
  int x;
  int i;
  int j;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  int coordZ_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  format = ConstPixelBufferAccess::getFormat(level);
  isFixedPoint = isFixedPointDepthTextureFormat(format);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  fVar9 = Vector<float,_2>::x(coord);
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),iVar3,fVar9,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  fVar9 = Vector<float,_2>::y(coord);
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),iVar3,fVar9,iVar4,iVar5);
  fVar9 = Vector<float,_2>::x(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::y(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  x = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar8 = deFloorFloatToInt32(fVar9);
  do {
    y = dVar6;
    if (dVar8 < x) {
      return false;
    }
    for (; y <= dVar7; y = y + 1) {
      WVar1 = sampler->wrapS;
      iVar3 = ConstPixelBufferAccess::getWidth(level);
      iVar3 = TexVerifierUtil::wrap(WVar1,y,iVar3);
      WVar1 = sampler->wrapT;
      iVar4 = ConstPixelBufferAccess::getHeight(level);
      iVar4 = TexVerifierUtil::wrap(WVar1,x,iVar4);
      fVar9 = lookupDepth(level,sampler,iVar3,iVar4,coordZ);
      resultSet = execCompare(sampler->compare,fVar9,cmpReference,prec->referenceBits,isFixedPoint);
      bVar2 = isResultInSet(resultSet,result,prec->resultBits);
      if (bVar2) {
        return true;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

static bool isNearestCompareResultValid (const ConstPixelBufferAccess&		level,
										 const Sampler&						sampler,
										 const TexComparePrecision&			prec,
										 const Vec2&						coord,
										 const int							coordZ,
										 const float						cmpReference,
										 const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x());
	const int	maxI		= deFloorFloatToInt32(uBounds.y());
	const int	minJ		= deFloorFloatToInt32(vBounds.x());
	const int	maxJ		= deFloorFloatToInt32(vBounds.y());

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int			x		= wrap(sampler.wrapS, i, level.getWidth());
			const int			y		= wrap(sampler.wrapT, j, level.getHeight());
			const float			depth	= lookupDepth(level, sampler, x, y, coordZ);
			const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

			if (isResultInSet(resSet, result, prec.resultBits))
				return true;
		}
	}

	return false;
}